

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O3

void __thiscall mocker::ir::Call::~Call(Call *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_001e98d0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_001e98f0;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&this->args);
  pcVar2 = (this->funcName)._M_dataplus._M_p;
  paVar1 = &(this->funcName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Definition_001e8c98;
  this_00 = (this->super_Definition).dest.
            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}